

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O0

Matrix33<double> * __thiscall
Imath_3_2::Matrix33<double>::operator*(Matrix33<double> *this,Matrix33<double> *v)

{
  double *in_RDX;
  double *in_RSI;
  Matrix33<double> *in_RDI;
  Matrix33<double> *tmp;
  
  Matrix33(in_RDI,UNINITIALIZED);
  in_RDI->x[0][0] = in_RSI[2] * in_RDX[6] + *in_RSI * *in_RDX + in_RSI[1] * in_RDX[3];
  in_RDI->x[0][1] = in_RSI[2] * in_RDX[7] + *in_RSI * in_RDX[1] + in_RSI[1] * in_RDX[4];
  in_RDI->x[0][2] = in_RSI[2] * in_RDX[8] + *in_RSI * in_RDX[2] + in_RSI[1] * in_RDX[5];
  in_RDI->x[1][0] = in_RSI[5] * in_RDX[6] + in_RSI[3] * *in_RDX + in_RSI[4] * in_RDX[3];
  in_RDI->x[1][1] = in_RSI[5] * in_RDX[7] + in_RSI[3] * in_RDX[1] + in_RSI[4] * in_RDX[4];
  in_RDI->x[1][2] = in_RSI[5] * in_RDX[8] + in_RSI[3] * in_RDX[2] + in_RSI[4] * in_RDX[5];
  in_RDI->x[2][0] = in_RSI[8] * in_RDX[6] + in_RSI[6] * *in_RDX + in_RSI[7] * in_RDX[3];
  in_RDI->x[2][1] = in_RSI[8] * in_RDX[7] + in_RSI[6] * in_RDX[1] + in_RSI[7] * in_RDX[4];
  in_RDI->x[2][2] = in_RSI[8] * in_RDX[8] + in_RSI[6] * in_RDX[2] + in_RSI[7] * in_RDX[5];
  return in_RDI;
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 inline Matrix33<T>
Matrix33<T>::operator* (const Matrix33<T>& v) const IMATH_NOEXCEPT
{
    // Avoid initializing with 0 values before immediately overwriting them,
    // and unroll all loops for the best autovectorization.
    Matrix33 tmp (IMATH_INTERNAL_NAMESPACE::UNINITIALIZED);

    tmp.x[0][0] =
        x[0][0] * v.x[0][0] + x[0][1] * v.x[1][0] + x[0][2] * v.x[2][0];
    tmp.x[0][1] =
        x[0][0] * v.x[0][1] + x[0][1] * v.x[1][1] + x[0][2] * v.x[2][1];
    tmp.x[0][2] =
        x[0][0] * v.x[0][2] + x[0][1] * v.x[1][2] + x[0][2] * v.x[2][2];

    tmp.x[1][0] =
        x[1][0] * v.x[0][0] + x[1][1] * v.x[1][0] + x[1][2] * v.x[2][0];
    tmp.x[1][1] =
        x[1][0] * v.x[0][1] + x[1][1] * v.x[1][1] + x[1][2] * v.x[2][1];
    tmp.x[1][2] =
        x[1][0] * v.x[0][2] + x[1][1] * v.x[1][2] + x[1][2] * v.x[2][2];

    tmp.x[2][0] =
        x[2][0] * v.x[0][0] + x[2][1] * v.x[1][0] + x[2][2] * v.x[2][0];
    tmp.x[2][1] =
        x[2][0] * v.x[0][1] + x[2][1] * v.x[1][1] + x[2][2] * v.x[2][1];
    tmp.x[2][2] =
        x[2][0] * v.x[0][2] + x[2][1] * v.x[1][2] + x[2][2] * v.x[2][2];

    return tmp;
}